

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqlite3.c
# Opt level: O0

void dropCell(MemPage *pPage,int idx,int sz,int *pRC)

{
  long lVar1;
  ushort iSize;
  uint uVar2;
  int iVar3;
  undefined1 *__dest;
  MemPage *in_RCX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int hdr;
  int rc;
  u8 *ptr;
  u8 *data;
  u32 pc;
  
  iVar3._0_1_ = in_RCX->isInit;
  iVar3._1_1_ = in_RCX->nOverflow;
  iVar3._2_1_ = in_RCX->intKey;
  iVar3._3_1_ = in_RCX->intKeyLeaf;
  if (iVar3 == 0) {
    lVar1 = *(long *)(in_RDI + 0x50);
    __dest = (undefined1 *)(*(long *)(in_RDI + 0x60) + (long)(in_ESI << 1));
    iSize = CONCAT11(*__dest,__dest[1]);
    uVar2 = (uint)*(byte *)(in_RDI + 6);
    if (((uint)iSize <
         (uint)CONCAT11(*(undefined1 *)(lVar1 + (int)(uVar2 + 5)),
                        *(undefined1 *)(lVar1 + 1 + (long)(int)(uVar2 + 5)))) ||
       (*(uint *)(*(long *)(in_RDI + 0x48) + 0x34) < (uint)iSize + in_EDX)) {
      iVar3 = sqlite3CorruptError(0);
      in_RCX->isInit = (char)iVar3;
      in_RCX->nOverflow = (char)((uint)iVar3 >> 8);
      in_RCX->intKey = (char)((uint)iVar3 >> 0x10);
      in_RCX->intKeyLeaf = (char)((uint)iVar3 >> 0x18);
    }
    else {
      iVar3 = freeSpace(in_RCX,0,iSize);
      if (iVar3 == 0) {
        *(short *)(in_RDI + 0x12) = *(short *)(in_RDI + 0x12) + -1;
        if (*(short *)(in_RDI + 0x12) == 0) {
          memset((void *)(lVar1 + (int)(uVar2 + 1)),0,4);
          *(undefined1 *)(lVar1 + (int)(uVar2 + 7)) = 0;
          *(char *)(lVar1 + (int)(uVar2 + 5)) =
               (char)((uint)*(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x34) >> 8);
          *(char *)(lVar1 + 1 + (long)(int)(uVar2 + 5)) =
               (char)*(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x34);
          *(ushort *)(in_RDI + 0x10) =
               (((short)*(undefined4 *)(*(long *)(in_RDI + 0x48) + 0x34) -
                (ushort)*(byte *)(in_RDI + 6)) - (ushort)*(byte *)(in_RDI + 7)) + -8;
        }
        else {
          memmove(__dest,__dest + 2,(long)(int)(((uint)*(ushort *)(in_RDI + 0x12) - in_ESI) * 2));
          *(char *)(lVar1 + (int)(uVar2 + 3)) = (char)((ushort)*(undefined2 *)(in_RDI + 0x12) >> 8);
          *(char *)(lVar1 + 1 + (long)(int)(uVar2 + 3)) = (char)*(undefined2 *)(in_RDI + 0x12);
          *(short *)(in_RDI + 0x10) = *(short *)(in_RDI + 0x10) + 2;
        }
      }
      else {
        in_RCX->isInit = (char)iVar3;
        in_RCX->nOverflow = (char)((uint)iVar3 >> 8);
        in_RCX->intKey = (char)((uint)iVar3 >> 0x10);
        in_RCX->intKeyLeaf = (char)((uint)iVar3 >> 0x18);
      }
    }
  }
  return;
}

Assistant:

static void dropCell(MemPage *pPage, int idx, int sz, int *pRC){
  u32 pc;         /* Offset to cell content of cell being deleted */
  u8 *data;       /* pPage->aData */
  u8 *ptr;        /* Used to move bytes around within data[] */
  int rc;         /* The return code */
  int hdr;        /* Beginning of the header.  0 most pages.  100 page 1 */

  if( *pRC ) return;

  assert( idx>=0 && idx<pPage->nCell );
  assert( sz==cellSize(pPage, idx) );
  assert( sqlite3PagerIswriteable(pPage->pDbPage) );
  assert( sqlite3_mutex_held(pPage->pBt->mutex) );
  data = pPage->aData;
  ptr = &pPage->aCellIdx[2*idx];
  pc = get2byte(ptr);
  hdr = pPage->hdrOffset;
  testcase( pc==get2byte(&data[hdr+5]) );
  testcase( pc+sz==pPage->pBt->usableSize );
  if( pc < (u32)get2byte(&data[hdr+5]) || pc+sz > pPage->pBt->usableSize ){
    *pRC = SQLITE_CORRUPT_BKPT;
    return;
  }
  rc = freeSpace(pPage, pc, sz);
  if( rc ){
    *pRC = rc;
    return;
  }
  pPage->nCell--;
  if( pPage->nCell==0 ){
    memset(&data[hdr+1], 0, 4);
    data[hdr+7] = 0;
    put2byte(&data[hdr+5], pPage->pBt->usableSize);
    pPage->nFree = pPage->pBt->usableSize - pPage->hdrOffset
                       - pPage->childPtrSize - 8;
  }else{
    memmove(ptr, ptr+2, 2*(pPage->nCell - idx));
    put2byte(&data[hdr+3], pPage->nCell);
    pPage->nFree += 2;
  }
}